

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_basic.hpp
# Opt level: O0

void lest::report(ostream *os,message *e,string *test)

{
  ostream *poVar1;
  char *pcVar2;
  comment local_78;
  location local_48;
  string *local_20;
  string *test_local;
  message *e_local;
  ostream *os_local;
  
  local_20 = test;
  test_local = (string *)e;
  e_local = (message *)os;
  location::location(&local_48,&e->where);
  poVar1 = operator<<(os,&local_48);
  poVar1 = std::operator<<(poVar1,": ");
  poVar1 = std::operator<<(poVar1,(string *)(test_local + 0x10));
  comment::comment(&local_78,(comment *)(test_local + 0x58));
  poVar1 = operator<<(poVar1,&local_78);
  poVar1 = std::operator<<(poVar1,": ");
  poVar1 = std::operator<<(poVar1,(string *)test);
  poVar1 = std::operator<<(poVar1,": ");
  pcVar2 = (char *)(**(code **)(*(long *)test_local + 0x10))();
  poVar1 = std::operator<<(poVar1,pcVar2);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  comment::~comment(&local_78);
  location::~location(&local_48);
  return;
}

Assistant:

inline void report( std::ostream & os, message const & e, std::string test )
{
    os << e.where << ": " << e.kind << e.note << ": " << test << ": " << e.what() << std::endl;
}